

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ClassConfidenceThresholding::Clear(ClassConfidenceThresholding *this)

{
  uint32_t cached_has_bits;
  ClassConfidenceThresholding *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::Clear
            (&this->precisionrecallcurves_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ClassConfidenceThresholding::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ClassConfidenceThresholding)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  precisionrecallcurves_.Clear();
  _internal_metadata_.Clear<std::string>();
}